

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

void __thiscall luna::Closure::Accept(Closure *this,GCObjectVisitor *v)

{
  pointer ppUVar1;
  bool bVar2;
  ulong uVar3;
  long *in_RSI;
  vector<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_> *in_RDI;
  Upvalue **upvalue;
  iterator __end2;
  iterator __begin2;
  vector<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_> *__range2;
  __normal_iterator<luna::Upvalue_**,_std::vector<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<luna::Upvalue_**,_std::vector<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>_>
  local_20;
  pointer *local_18;
  long *local_10;
  
  local_10 = in_RSI;
  uVar3 = (**(code **)(*in_RSI + 0x10))();
  if ((uVar3 & 1) != 0) {
    ppUVar1 = in_RDI[1].super__Vector_base<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    (**(code **)&((*ppUVar1)->super_GCObject).field_0x10)(ppUVar1,local_10);
    local_18 = &in_RDI[1].super__Vector_base<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    local_20._M_current =
         (Upvalue **)std::vector<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>::begin(in_RDI);
    std::vector<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>::end(in_RDI);
    while (bVar2 = __gnu_cxx::operator!=
                             (in_stack_ffffffffffffffd0,
                              (__normal_iterator<luna::Upvalue_**,_std::vector<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>_>
                               *)in_RDI), bVar2) {
      in_stack_ffffffffffffffd0 =
           (__normal_iterator<luna::Upvalue_**,_std::vector<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>_>
            *)__gnu_cxx::
              __normal_iterator<luna::Upvalue_**,_std::vector<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>_>
              ::operator*(&local_20);
      (*(((Upvalue *)in_stack_ffffffffffffffd0->_M_current)->super_GCObject)._vptr_GCObject[2])
                ((Upvalue *)in_stack_ffffffffffffffd0->_M_current,local_10);
      __gnu_cxx::
      __normal_iterator<luna::Upvalue_**,_std::vector<luna::Upvalue_*,_std::allocator<luna::Upvalue_*>_>_>
      ::operator++(&local_20);
    }
  }
  return;
}

Assistant:

void Closure::Accept(GCObjectVisitor *v)
    {
        if (v->Visit(this))
        {
            prototype_->Accept(v);

            for (const auto &upvalue : upvalues_)
                upvalue->Accept(v);
        }
    }